

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O0

bool __thiscall
anurbs::TypeEntry<anurbs::BrepEdge,_anurbs::Model>::load
          (TypeEntry<anurbs::BrepEdge,_anurbs::Model> *this,Model *model,Json *source)

{
  ulong uVar1;
  element_type *this_00;
  Ref<anurbs::BrepEdge> local_c8;
  shared_ptr<anurbs::BrepEdge> local_b8;
  undefined1 local_a8 [32];
  undefined1 local_88 [24];
  Ref<anurbs::BrepEdge> ref;
  undefined1 local_58 [16];
  Pointer<anurbs::BrepEdge> data;
  string key;
  Json *source_local;
  Model *model_local;
  TypeEntry<anurbs::BrepEdge,_anurbs::Model> *this_local;
  
  key_from_json((string *)
                &data.super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                source);
  BrepEdge::load((BrepEdge *)local_58,model,source);
  std::shared_ptr<anurbs::BrepEdge>::
  shared_ptr<anurbs::BrepEdge,std::default_delete<anurbs::BrepEdge>,void>
            ((shared_ptr<anurbs::BrepEdge> *)(local_58 + 8),
             (unique_ptr<anurbs::BrepEdge,_std::default_delete<anurbs::BrepEdge>_> *)local_58);
  std::unique_ptr<anurbs::BrepEdge,_std::default_delete<anurbs::BrepEdge>_>::~unique_ptr
            ((unique_ptr<anurbs::BrepEdge,_std::default_delete<anurbs::BrepEdge>_> *)local_58);
  Ref<anurbs::BrepEdge>::Ref((Ref<anurbs::BrepEdge> *)(local_88 + 0x10));
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::shared_ptr<anurbs::BrepEdge>::shared_ptr
              (&local_b8,(shared_ptr<anurbs::BrepEdge> *)(local_58 + 8));
    Model::add<anurbs::BrepEdge>
              ((Model *)local_a8,(string *)model,
               (Pointer<anurbs::BrepEdge> *)
               &data.super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Ref<anurbs::BrepEdge>::operator=
              ((Ref<anurbs::BrepEdge> *)(local_88 + 0x10),(Ref<anurbs::BrepEdge> *)local_a8);
    Ref<anurbs::BrepEdge>::~Ref((Ref<anurbs::BrepEdge> *)local_a8);
    std::shared_ptr<anurbs::BrepEdge>::~shared_ptr(&local_b8);
  }
  else {
    std::shared_ptr<anurbs::BrepEdge>::shared_ptr
              ((shared_ptr<anurbs::BrepEdge> *)(local_a8 + 0x10),
               (shared_ptr<anurbs::BrepEdge> *)(local_58 + 8));
    Model::add<anurbs::BrepEdge>((Model *)local_88,(Pointer<anurbs::BrepEdge> *)model);
    Ref<anurbs::BrepEdge>::operator=
              ((Ref<anurbs::BrepEdge> *)(local_88 + 0x10),(Ref<anurbs::BrepEdge> *)local_88);
    Ref<anurbs::BrepEdge>::~Ref((Ref<anurbs::BrepEdge> *)local_88);
    std::shared_ptr<anurbs::BrepEdge>::~shared_ptr
              ((shared_ptr<anurbs::BrepEdge> *)(local_a8 + 0x10));
  }
  Ref<anurbs::BrepEdge>::attributes(&local_c8);
  this_00 = std::__shared_ptr_access<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&local_c8);
  Attributes::
  load<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (this_00,model,source);
  std::shared_ptr<anurbs::Attributes>::~shared_ptr((shared_ptr<anurbs::Attributes> *)&local_c8);
  Ref<anurbs::BrepEdge>::~Ref((Ref<anurbs::BrepEdge> *)(local_88 + 0x10));
  std::shared_ptr<anurbs::BrepEdge>::~shared_ptr((shared_ptr<anurbs::BrepEdge> *)(local_58 + 8));
  std::__cxx11::string::~string
            ((string *)
             &data.super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return true;
}

Assistant:

bool load(TModel& model, const Json& source) override
    {
        const auto key = key_from_json(source);

        Pointer<TData> data = TData::load(model, source);

        Ref<TData> ref;

        if (key.empty()) {
            ref = model.template add<TData>(data);
        } else {
            ref = model.template add<TData>(key, data);
        }

        ref.attributes()->load(model, source);

        return true;
    }